

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void handle_directory_request(mg_connection *conn,char *dir)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  time_t local_a8;
  time_t curtime;
  char *title;
  char *p;
  char *esc;
  char date [64];
  void *local_40;
  dir_scan_data data;
  de *pdStack_20;
  int sort_direction;
  size_t i;
  char *dir_local;
  mg_connection *conn_local;
  
  local_40 = (void *)0x0;
  data.entries = (de *)0x0;
  data.num_entries = 0x80;
  local_a8 = time((time_t *)0x0);
  if (conn != (mg_connection *)0x0) {
    iVar1 = scan_directory(conn,dir,&local_40,dir_scan_callback);
    if (iVar1 == 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      mg_send_http_error(conn,500,"Error: Cannot open directory\nopendir(%s): %s",dir,pcVar3);
    }
    else {
      gmt_time_string((char *)&esc,0x40,&local_a8);
      p = (char *)0x0;
      pcVar3 = (conn->request_info).local_uri;
      curtime = (time_t)pcVar3;
      sVar4 = strcspn(pcVar3,"&<>");
      if (pcVar3[sVar4] != '\0') {
        sVar4 = strlen((char *)curtime);
        p = (char *)mg_malloc(sVar4 * 5 + 1);
        if (p == (char *)0x0) {
          curtime = (long)":,; \t" + 5;
        }
        else {
          pdStack_20 = (de *)0x0;
          title = p;
          while (*(char *)(curtime + (long)pdStack_20) != '\0') {
            mg_strlcpy(title,(char *)(curtime + (long)pdStack_20),2);
            if (*title == '&') {
              strcpy(title,"&amp;");
            }
            else if (*title == '<') {
              strcpy(title,"&lt;");
            }
            else if (*title == '>') {
              strcpy(title,"&gt;");
            }
            pdStack_20 = (de *)((long)pdStack_20 + 1);
            sVar4 = strlen(title);
            title = title + sVar4;
          }
        }
      }
      bVar5 = false;
      if (((conn->request_info).query_string != (char *)0x0) &&
         (bVar5 = false, *(conn->request_info).query_string != '\0')) {
        bVar5 = (conn->request_info).query_string[1] == 'd';
      }
      data.arr_size._4_4_ = 100;
      if (bVar5) {
        data.arr_size._4_4_ = 0x61;
      }
      conn->must_close = 1;
      mg_response_header_start(conn,200);
      send_static_cache_header(conn);
      send_additional_header(conn);
      mg_response_header_add(conn,"Content-Type","text/html; charset=utf-8",-1);
      mg_response_header_send(conn);
      pcVar3 = (char *)curtime;
      if (p != (char *)0x0) {
        pcVar3 = p;
      }
      mg_printf(conn,
                "<!DOCTYPE html><html><head><title>Index of %s</title><style>th {text-align: left;}</style></head><body><h1>Index of %s</h1><pre><table cellpadding=\"0\"><tr><th><a href=\"?n%c\">Name</a></th><th><a href=\"?d%c\">Modified</a></th><th><a href=\"?s%c\">Size</a></th></tr><tr><td colspan=\"3\"><hr></td></tr>"
                ,pcVar3,pcVar3,(ulong)data.arr_size._4_4_,(ulong)data.arr_size._4_4_,
                data.arr_size._4_4_);
      mg_free(p);
      mg_printf(conn,
                "<tr><td><a href=\"%s\">%s</a></td><td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n",
                "..","Parent directory","-");
      if (local_40 != (void *)0x0) {
        mg_sort(local_40,(size_t)data.entries,0x28,compare_dir_entries,
                (conn->request_info).query_string);
        for (pdStack_20 = (de *)0x0; pdStack_20 < data.entries;
            pdStack_20 = (de *)((long)&pdStack_20->file_name + 1)) {
          print_dir_entry(conn,(de *)((long)local_40 + (long)pdStack_20 * 0x28));
          mg_free(*(void **)((long)local_40 + (long)pdStack_20 * 0x28));
        }
        mg_free(local_40);
      }
      mg_printf(conn,"%s","</table></pre></body></html>");
      conn->status_code = 200;
    }
  }
  return;
}

Assistant:

static void
handle_directory_request(struct mg_connection *conn, const char *dir)
{
	size_t i;
	int sort_direction;
	struct dir_scan_data data = {NULL, 0, 128};
	char date[64], *esc, *p;
	const char *title;
	time_t curtime = time(NULL);

	if (!conn) {
		return;
	}

	if (!scan_directory(conn, dir, &data, dir_scan_callback)) {
		mg_send_http_error(conn,
		                   500,
		                   "Error: Cannot open directory\nopendir(%s): %s",
		                   dir,
		                   strerror(ERRNO));
		return;
	}

	gmt_time_string(date, sizeof(date), &curtime);

	esc = NULL;
	title = conn->request_info.local_uri;
	if (title[strcspn(title, "&<>")]) {
		/* HTML escaping needed */
		esc = (char *)mg_malloc(strlen(title) * 5 + 1);
		if (esc) {
			for (i = 0, p = esc; title[i]; i++, p += strlen(p)) {
				mg_strlcpy(p, title + i, 2);
				if (*p == '&') {
					strcpy(p, "&amp;");
				} else if (*p == '<') {
					strcpy(p, "&lt;");
				} else if (*p == '>') {
					strcpy(p, "&gt;");
				}
			}
		} else {
			title = "";
		}
	}

	sort_direction = ((conn->request_info.query_string != NULL)
	                  && (conn->request_info.query_string[0] != '\0')
	                  && (conn->request_info.query_string[1] == 'd'))
	                     ? 'a'
	                     : 'd';

	conn->must_close = 1;

	/* Create 200 OK response */
	mg_response_header_start(conn, 200);
	send_static_cache_header(conn);
	send_additional_header(conn);
	mg_response_header_add(conn,
	                       "Content-Type",
	                       "text/html; charset=utf-8",
	                       -1);

	/* Send all headers */
	mg_response_header_send(conn);

	/* Body */
	mg_printf(conn,
	          "<!DOCTYPE html>"
	          "<html><head><title>Index of %s</title>"
	          "<style>th {text-align: left;}</style></head>"
	          "<body><h1>Index of %s</h1><pre><table cellpadding=\"0\">"
	          "<tr><th><a href=\"?n%c\">Name</a></th>"
	          "<th><a href=\"?d%c\">Modified</a></th>"
	          "<th><a href=\"?s%c\">Size</a></th></tr>"
	          "<tr><td colspan=\"3\"><hr></td></tr>",
	          esc ? esc : title,
	          esc ? esc : title,
	          sort_direction,
	          sort_direction,
	          sort_direction);
	mg_free(esc);

	/* Print first entry - link to a parent directory */
	mg_printf(conn,
	          "<tr><td><a href=\"%s\">%s</a></td>"
	          "<td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n",
	          "..",
	          "Parent directory",
	          "-",
	          "-");

	/* Sort and print directory entries */
	if (data.entries != NULL) {
		mg_sort(data.entries,
		        data.num_entries,
		        sizeof(data.entries[0]),
		        compare_dir_entries,
		        (void *)conn->request_info.query_string);
		for (i = 0; i < data.num_entries; i++) {
			print_dir_entry(conn, &data.entries[i]);
			mg_free(data.entries[i].file_name);
		}
		mg_free(data.entries);
	}

	mg_printf(conn, "%s", "</table></pre></body></html>");
	conn->status_code = 200;
}